

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O2

void __thiscall agge::tests::MiscTests::RawMemoryObjectReturnsNonNullAddress(MiscTests *this)

{
  allocator local_69;
  double *local_68;
  string local_60;
  raw_memory_object rmo;
  LocationInfo local_30;
  
  rmo._buffer = (uint8_t *)0x0;
  rmo._size = 0;
  local_68 = (double *)raw_memory_object::get<int>(&rmo,1);
  std::__cxx11::string::string
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_69);
  ut::LocationInfo::LocationInfo(&local_30,&local_60,0x1b);
  ut::is_not_null<int*>((int **)&local_68,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_68 = raw_memory_object::get<double>(&rmo,5);
  std::__cxx11::string::string
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_69);
  ut::LocationInfo::LocationInfo(&local_30,&local_60,0x1c);
  ut::is_not_null<double*>(&local_68,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  raw_memory_object::~raw_memory_object(&rmo);
  return;
}

Assistant:

test( RawMemoryObjectReturnsNonNullAddress )
			{
				// INIT / ACT
				raw_memory_object rmo;

				// ACT / ASSERT
				assert_not_null(rmo.get<int>(1));
				assert_not_null(rmo.get<double>(5));
			}